

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(void)

{
  double dVar1;
  long lVar2;
  long lVar3;
  uint32_t vKeyFrame;
  int32_t j;
  long lVar4;
  float fVar5;
  VoxWriter vox;
  uint8_t local_241;
  float local_240;
  uint32_t local_23c;
  _Any_data local_238;
  code *local_228;
  code *local_220;
  VoxelZ local_210;
  VoxelY local_208;
  long local_200;
  double local_1f8;
  double local_1f0;
  undefined1 local_1e8 [16];
  VoxWriter local_1d0;
  
  local_238._M_unused._M_member_pointer = 0x7e;
  local_208 = 0x7e;
  local_210 = 0x7e;
  ::vox::VoxWriter::VoxWriter(&local_1d0,(VoxelX *)local_238._M_pod_data,&local_208,&local_210);
  local_238._M_unused._M_object = (void *)0x0;
  local_238._8_8_ = 0;
  local_220 = std::
              _Function_handler<void_(const_unsigned_int_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/aiekick[P]MagicaVoxel_File_Writer/main.cpp:85:39)>
              ::_M_invoke;
  local_228 = std::
              _Function_handler<void_(const_unsigned_int_&,_const_double_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/aiekick[P]MagicaVoxel_File_Writer/main.cpp:85:39)>
              ::_M_manager;
  ::vox::VoxWriter::SetKeyFrameTimeLoggingFunctor
            (&local_1d0,(KeyFrameTimeLoggingFunctor *)&local_238);
  if (local_228 != (code *)0x0) {
    (*local_228)(&local_238,&local_238,3);
  }
  ::vox::VoxWriter::StartTimeLogging(&local_1d0);
  vKeyFrame = 0;
  local_240 = 0.0;
  do {
    local_23c = vKeyFrame;
    ::vox::VoxWriter::SetKeyFrame(&local_1d0,vKeyFrame);
    local_1f8 = (double)local_240;
    lVar3 = -0xbd;
    do {
      lVar4 = -0xbd;
      local_200 = lVar3;
      do {
        fVar5 = (float)((int)lVar4 * (int)lVar4 + (int)lVar3 * (int)lVar3) * 2.7994736e-05;
        local_1e8 = ZEXT416((uint)fVar5);
        local_1f0 = (double)fVar5;
        dVar1 = sin(local_1f0 * 10.0 + local_1f8);
        lVar2 = (long)(int)(local_1f0 * 100.0) * 0x80808081;
        local_208 = lVar4 + 0xbd;
        local_210 = (VoxelZ)(int)((double)ABS((float)local_1e8._0_4_ * -25.0 + 50.0) *
                                 (dVar1 * 0.5 + 0.5));
        local_241 = ((char)(uint)((ulong)lVar2 >> 0x27) - (char)(lVar2 >> 0x3f)) +
                    (char)(int)(local_1f0 * 100.0) + '\x01';
        local_238._M_unused._M_object = (void *)(lVar3 + 0xbd);
        ::vox::VoxWriter::AddVoxel
                  (&local_1d0,(size_t *)local_238._M_pod_data,&local_208,&local_210,&local_241);
        lVar4 = lVar4 + 1;
      } while (lVar4 != 0xbd);
      lVar3 = local_200 + 1;
    } while (lVar3 != 0xbd);
    local_240 = local_240 + 0.5;
    vKeyFrame = local_23c + 1;
  } while (vKeyFrame != 0x1e);
  ::vox::VoxWriter::StopTimeLogging(&local_1d0);
  local_238._M_unused._M_object = &local_228;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_238,"output_voxwriter.vox","");
  ::vox::VoxWriter::SaveToFile(&local_1d0,(string *)&local_238);
  if ((code **)local_238._M_unused._0_8_ != &local_228) {
    operator_delete(local_238._M_unused._M_object);
  }
  ::vox::VoxWriter::PrintStats(&local_1d0);
  ::vox::VoxWriter::~VoxWriter(&local_1d0);
  return 0;
}

Assistant:

int main() {
    const int32_t  SIZE      = 189;
    const int32_t  OFFSET    = SIZE;
    const float    Z_SCALE   = 1.0f;
    const int32_t  FRAMES    = 30;
    const float    len_ratio = 1.0f / (SIZE * SIZE);
    vox::VoxWriter vox;
    vox.SetKeyFrameTimeLoggingFunctor([](const vox::KeyFrame& vKeyFrame, const double& vValue) {  //
        std::cout << "Elapsed time for Frame " << vKeyFrame << " : " << vValue << " secs" << std::endl;
    });
    vox.StartTimeLogging();
    float time = 0.0f;
    for (int32_t k = 0; k < FRAMES; ++k) {
        vox.SetKeyFrame(k);
        for (int32_t i = -SIZE; i < SIZE; ++i) {
            for (int32_t j = -SIZE; j < SIZE; ++j) {
                float   len        = (i * i + j * j) * len_ratio;
                int32_t pz         = (int32_t)((std::sin(len * 10.0 + time) * 0.5 + 0.5) * (std::abs(50.0f - 25.0f * len)) * Z_SCALE);
                int32_t cube_color = (int32_t)(len * 100.0) % 255 + 1;
                vox.AddVoxel(i + OFFSET, j + OFFSET, pz, cube_color);  // magicavoxel use the z as up axis
            }
        }
        time += 0.5f;
    }
    vox.StopTimeLogging();
    vox.SaveToFile("output_voxwriter.vox");
    vox.PrintStats();
}